

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<Catch::IStreamingReporter> * __thiscall
Catch::Ptr<Catch::IStreamingReporter>::operator=
          (Ptr<Catch::IStreamingReporter> *this,IStreamingReporter *p)

{
  Ptr<Catch::IStreamingReporter> *in_RDI;
  Ptr<Catch::IStreamingReporter> temp;
  Ptr<Catch::IStreamingReporter> *this_00;
  Ptr<Catch::IStreamingReporter> local_18 [3];
  
  this_00 = local_18;
  Ptr(this_00,(IStreamingReporter *)in_RDI);
  swap(this_00,in_RDI);
  ~Ptr(this_00);
  return in_RDI;
}

Assistant:

Ptr& operator = ( T* p ){
            Ptr temp( p );
            swap( temp );
            return *this;
        }